

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O0

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  int iVar1;
  undefined4 extraout_var;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  CheckValue<double> CVar16;
  CheckValue<double> CVar17;
  IkReal x646;
  IkReal x645;
  IkReal x644;
  IkReal x643;
  IkReal x642;
  IkReal x641;
  IkReal x640;
  IkReal x639;
  IkReal x638;
  IkReal x637;
  IkReal x636;
  IkReal evalcond_2 [5];
  int local_488;
  int local_484;
  int iij1_2;
  int ij1_2;
  CheckValue<double> x635;
  CheckValue<double> x634;
  IkReal x633;
  IkReal x632;
  IkReal x631;
  IkReal x630;
  IkReal x629;
  IkReal x628;
  double dStack_428;
  bool j1valid_2 [1];
  IkReal sj1array_2 [1];
  IkReal cj1array_2 [1];
  IkReal j1array_2 [1];
  IkReal x627;
  IkReal x626;
  IkReal x625;
  IkReal x624;
  IkReal x623;
  IkReal x622;
  IkReal x621;
  IkReal x620;
  IkReal x619;
  IkReal x618;
  IkReal x617;
  IkReal evalcond_1 [5];
  int iij1_1;
  int ij1_1;
  CheckValue<double> x616;
  CheckValue<double> x615;
  IkReal x614;
  IkReal x613;
  IkReal x612;
  IkReal x611;
  IkReal x610;
  IkReal x609;
  IkReal x608;
  double dStack_328;
  bool j1valid_1 [1];
  IkReal sj1array_1 [1];
  IkReal cj1array_1 [1];
  IkReal j1array_1 [1];
  IkReal x105;
  IkReal x104;
  IkReal x103;
  IkReal x102;
  IkReal x101;
  IkReal x100;
  IkReal x99;
  IkReal x98;
  IkReal x97;
  IkReal x96;
  IkReal x95;
  IkReal evalcond [5];
  int iij1;
  int ij1;
  CheckValue<double> x94;
  CheckValue<double> x93;
  IkReal x92;
  IkReal x91;
  IkReal x90;
  IkReal x89;
  IkReal x88;
  IkReal x87;
  IkReal x86;
  IkReal x85;
  double dStack_220;
  bool j1valid [1];
  IkReal sj1array [1];
  IkReal cj1array [1];
  IkReal j1array [1];
  IkReal x84;
  IkReal x83;
  IkReal x82;
  IkReal x81;
  IkReal x80;
  IkReal x79;
  IkReal x78;
  IkReal x77;
  IkReal j1eval_2 [2];
  IkReal x76;
  IkReal x75;
  IkReal x74;
  IkReal x73;
  IkReal x72;
  IkReal x71;
  IkReal x70;
  IkReal j1eval_1 [2];
  IkReal x69;
  IkReal x68;
  IkReal x67;
  IkReal x66;
  IkReal x65;
  IkReal x64;
  IkReal x63;
  IkReal x62;
  IkReal x61;
  IkReal x60;
  IkReal j1eval [3];
  int iij2;
  int ij2;
  IkReal x59;
  double dStack_e8;
  bool j2valid [2];
  IkReal sj2array [2];
  IkReal cj2array [2];
  IkReal j2array [2];
  int local_b0;
  int local_ac;
  int iij0;
  int ij0;
  IkReal x57;
  CheckValue<double> x58;
  bool j0valid [2];
  IkReal sj0array [2];
  IkReal cj0array [2];
  IkReal j0array [2];
  IkReal j0eval [1];
  IkReal x56;
  IkReal x55;
  IkReal x54;
  int dummyiter;
  IkSolutionListBase<double> *solutions_local;
  IkReal *pfree_local;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  IKSolver *this_local;
  
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j0 = dVar2;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j1 = dVar2;
  this->_ij1[0] = 0xff;
  this->_ij1[1] = 0xff;
  this->_nj1 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j2 = dVar2;
  this->_ij2[0] = 0xff;
  this->_ij2[1] = 0xff;
  this->_nj2 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j3 = dVar2;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j4 = dVar2;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j5 = dVar2;
  this->_ij5[0] = 0xff;
  this->_ij5[1] = 0xff;
  this->_nj5 = 0xff;
  x54._4_4_ = 0;
  do {
    if (0 < x54._4_4_) {
      iVar1 = (*solutions->_vptr_IkSolutionListBase[4])();
      return CONCAT44(extraout_var,iVar1) != 0;
    }
    (*solutions->_vptr_IkSolutionListBase[5])();
    this->r00 = *eerot;
    this->r01 = eerot[1];
    this->r02 = eerot[2];
    this->r10 = eerot[3];
    this->r11 = eerot[4];
    this->r12 = eerot[5];
    this->r20 = eerot[6];
    this->r21 = eerot[7];
    this->r22 = eerot[8];
    this->px = *eetrans;
    this->py = eetrans[1];
    this->pz = eetrans[2];
    this->new_r00 = this->r02;
    this->new_r01 = this->r01;
    this->new_r02 = this->r00 * -1.0;
    this->new_px = this->r00 * -0.08 + this->px;
    this->new_r10 = this->r12 * -1.0;
    this->new_r11 = this->r11 * -1.0;
    this->new_r12 = this->r10;
    this->new_py = this->r10 * 0.08 - this->py;
    this->new_r20 = this->r22 * -1.0;
    this->new_r21 = this->r21 * -1.0;
    this->new_r22 = this->r20;
    this->new_pz = this->r20 * 0.08 + (0.4 - this->pz);
    this->r00 = this->new_r00;
    this->r01 = this->new_r01;
    this->r02 = this->new_r02;
    this->r10 = this->new_r10;
    this->r11 = this->new_r11;
    this->r12 = this->new_r12;
    this->r20 = this->new_r20;
    this->r21 = this->new_r21;
    this->r22 = this->new_r22;
    this->px = this->new_px;
    this->py = this->new_py;
    this->pz = this->new_pz;
    dVar2 = this->px * 1.0;
    dVar3 = this->pz * 1.0;
    dVar4 = this->py * 1.0;
    this->pp = this->pz * this->pz + this->px * this->px + this->py * this->py;
    this->npx = this->pz * this->r20 + this->px * this->r00 + this->py * this->r10;
    this->npy = this->pz * this->r21 + this->px * this->r01 + this->py * this->r11;
    this->npz = this->pz * this->r22 + this->px * this->r02 + this->py * this->r12;
    this->rxp0_0 = this->r20 * -1.0 * dVar4 + this->pz * this->r10;
    this->rxp0_1 = this->px * this->r20 + this->r00 * -1.0 * dVar3;
    this->rxp0_2 = this->r10 * -1.0 * dVar2 + this->py * this->r00;
    this->rxp1_0 = this->r21 * -1.0 * dVar4 + this->pz * this->r11;
    this->rxp1_1 = this->px * this->r21 + this->r01 * -1.0 * dVar3;
    this->rxp1_2 = this->r11 * -1.0 * dVar2 + this->py * this->r01;
    this->rxp2_0 = this->pz * this->r12 + this->r22 * -1.0 * dVar4;
    this->rxp2_1 = this->px * this->r22 + this->r02 * -1.0 * dVar3;
    this->rxp2_2 = this->r12 * -1.0 * dVar2 + this->py * this->r02;
    dVar2 = IKabs(this->px);
    dVar3 = IKabs(this->py);
    dVar2 = IKabs(dVar2 + dVar3);
    if (1e-06 <= dVar2) {
      memset(&x58.field_0xe,0,2);
      this->_nj0 = '\x02';
      CVar16 = IKatan2WithCheck<double>(this->py,this->px * -1.0,1e-07);
      x58.value._0_1_ = CVar16.valid;
      if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cj0array[1] = CVar16.value * -1.0;
        IKsin(cj0array[1]);
        sj0array[1] = IKcos(cj0array[1]);
        dVar2 = 3.14159265358979 - CVar16.value;
        sj0array[0] = IKsin(dVar2);
        cj0array[0] = IKcos(dVar2);
        if (cj0array[1] <= 3.14159265358979) {
          if (cj0array[1] < -3.14159265358979) {
            cj0array[1] = cj0array[1] + 6.28318530717959;
          }
        }
        else {
          cj0array[1] = cj0array[1] - 6.28318530717959;
        }
        x58._14_1_ = 1;
        x58._15_1_ = 1;
        for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
          if (((&x58.field_0xe)[local_ac] & 1) != 0) {
            this->_ij0[0] = (uchar)local_ac;
            this->_ij0[1] = 0xff;
            local_b0 = local_ac;
            do {
              local_b0 = local_b0 + 1;
              if (1 < local_b0) goto LAB_00146388;
            } while (((((&x58.field_0xe)[local_b0] & 1) == 0) ||
                     (dVar2 = IKabs(sj0array[(long)local_ac + 1] - sj0array[(long)local_b0 + 1]),
                     1e-06 <= dVar2)) ||
                    (dVar2 = IKabs(cj0array[(long)local_ac + -3] - cj0array[(long)local_b0 + -3]),
                    1e-06 <= dVar2));
            (&x58.field_0xe)[local_b0] = 0;
            this->_ij0[1] = (uchar)local_b0;
LAB_00146388:
            this->j0 = cj0array[(long)local_ac + 1];
            this->cj0 = sj0array[(long)local_ac + 1];
            this->sj0 = cj0array[(long)local_ac + -3];
            memset((void *)((long)&x59 + 6),0,2);
            this->_nj2 = '\x02';
            if ((-1.0000001 <=
                 this->pp * -4.328914889538 +
                 this->py * 0.2164457444769 * this->sj0 +
                 this->cj0 * 0.2164457444769 * this->px + 1.00885361500683) &&
               (this->pp * -4.328914889538 +
                this->py * 0.2164457444769 * this->sj0 +
                this->cj0 * 0.2164457444769 * this->px + 1.00885361500683 <= 1.0000001)) {
              dVar2 = IKasin(this->pp * -4.328914889538 +
                             this->py * 0.2164457444769 * this->sj0 +
                             this->cj0 * 0.2164457444769 * this->px + 1.00885361500683);
              cj2array[1] = -1.47519820813106 - dVar2;
              dStack_e8 = IKsin(cj2array[1]);
              sj2array[1] = IKcos(cj2array[1]);
              sj2array[0] = IKsin(dVar2 + 1.66639444545874);
              cj2array[0] = IKcos(dVar2 + 1.66639444545874);
              if (cj2array[1] <= 3.14159265358979) {
                if (cj2array[1] < -3.14159265358979) {
                  cj2array[1] = cj2array[1] + 6.28318530717959;
                }
              }
              else {
                cj2array[1] = cj2array[1] - 6.28318530717959;
              }
              x59._6_1_ = 1;
              x59._7_1_ = 1;
              for (j1eval[2]._4_4_ = 0; j1eval[2]._4_4_ < 2; j1eval[2]._4_4_ = j1eval[2]._4_4_ + 1)
              {
                if ((*(byte *)((long)&x59 + (long)j1eval[2]._4_4_ + 6) & 1) != 0) {
                  this->_ij2[0] = (uchar)j1eval[2]._4_4_;
                  this->_ij2[1] = 0xff;
                  j1eval[2]._0_4_ = j1eval[2]._4_4_;
                  do {
                    j1eval[2]._0_4_ = j1eval[2]._0_4_ + 1;
                    if (1 < j1eval[2]._0_4_) goto LAB_001467a3;
                  } while ((((*(byte *)((long)&x59 + (long)j1eval[2]._0_4_ + 6) & 1) == 0) ||
                           (dVar2 = IKabs(sj2array[(long)j1eval[2]._4_4_ + 1] -
                                          sj2array[(long)j1eval[2]._0_4_ + 1]), 1e-06 <= dVar2)) ||
                          (dVar2 = IKabs(cj2array[(long)j1eval[2]._4_4_ + -3] -
                                         cj2array[(long)j1eval[2]._0_4_ + -3]), 1e-06 <= dVar2));
                  *(undefined1 *)((long)&x59 + (long)j1eval[2]._0_4_ + 6) = 0;
                  this->_ij2[1] = (uchar)j1eval[2]._0_4_;
LAB_001467a3:
                  this->j2 = cj2array[(long)j1eval[2]._4_4_ + 1];
                  this->cj2 = sj2array[(long)j1eval[2]._4_4_ + 1];
                  this->sj2 = cj2array[(long)j1eval[2]._4_4_ + -3];
                  dVar5 = this->cj2 * this->cj2;
                  dVar6 = this->cj2 * this->pz;
                  dVar7 = this->cj0 * this->px;
                  dVar8 = this->cj2 * this->sj2;
                  dVar9 = this->sj2 * 0.365;
                  dVar10 = this->py * this->sj0;
                  dVar11 = this->cj2 * 0.035;
                  dVar12 = this->sj2 * 417.142857142857;
                  dVar13 = this->pz * this->sj2;
                  dVar14 = this->cj2 * 40.0;
                  dVar2 = this->pz;
                  dVar3 = this->cj2;
                  dVar4 = this->sj2;
                  dVar15 = IKabs(this->pz * -0.025 +
                                 this->sj2 * 0.114975 +
                                 this->pz * dVar7 +
                                 this->pz * dVar10 +
                                 dVar5 * -0.02555 + this->cj2 * -0.011025 + dVar8 * 0.132 + 0.012775
                                );
                  dVar5 = IKabs(dVar8 * 0.02555 + this->pz * this->pz + dVar5 * 0.132 + -0.133225);
                  dVar8 = IKsign(dVar7 * -1.0 * dVar11 +
                                 this->cj2 * 0.000875 +
                                 dVar9 * dVar10 +
                                 dVar6 * 0.365 +
                                 this->pz * 0.315 +
                                 dVar10 * -1.0 * dVar11 +
                                 dVar7 * dVar9 + this->sj2 * -0.009125 + dVar13 * 0.035);
                  dVar2 = IKabs(dVar10 * dVar12 +
                                dVar7 * -1.0 * dVar14 +
                                dVar13 * 40.0 +
                                dVar10 * -1.0 * dVar14 +
                                dVar6 * 417.142857142857 +
                                dVar4 * -10.4285714285714 + dVar7 * dVar12 + dVar2 * 360.0 + dVar3);
                  if (((dVar2 < 1e-06) || (dVar2 = IKabs(dVar15 + dVar5), dVar2 < 1e-06)) ||
                     (dVar2 = IKabs(dVar8), dVar2 < 1e-06)) {
                    dVar5 = this->cj0 * this->px;
                    dVar6 = this->pz * this->sj2;
                    dVar7 = this->cj2 * this->pz;
                    dVar8 = this->py * this->sj0;
                    dVar9 = this->cj2 * 417.142857142857;
                    dVar10 = this->cj2 * 0.365;
                    dVar11 = this->sj2 * dVar8;
                    dVar2 = this->sj2;
                    dVar3 = this->cj2;
                    dVar4 = this->sj2;
                    dVar10 = IKsign(this->sj2 * -0.035 * dVar5 +
                                    dVar8 * -0.315 +
                                    dVar5 * -0.315 +
                                    dVar8 * -1.0 * dVar10 +
                                    this->sj2 * 0.000875 +
                                    dVar6 * 0.365 +
                                    dVar11 * -0.035 +
                                    dVar7 * -0.035 +
                                    dVar5 * -1.0 * dVar10 + this->cj2 * 0.009125 + 0.007875);
                    dVar2 = IKabs(dVar4 * -40.0 * dVar5 +
                                  dVar8 * -1.0 * dVar9 +
                                  dVar7 * -40.0 +
                                  dVar11 * -40.0 +
                                  dVar3 * 10.4285714285714 +
                                  dVar5 * -1.0 * dVar9 +
                                  dVar6 * 417.142857142857 + dVar5 * -360.0 + dVar8 * -360.0 + 9.0 +
                                  dVar2);
                    if ((dVar2 < 1e-06) || (dVar2 = IKabs(dVar10), dVar2 < 1e-06)) {
                      dVar2 = this->cj0 * this->cj0;
                      dVar3 = this->py * this->py;
                      dVar4 = this->pz * this->pz;
                      dVar5 = this->cj0 * this->px;
                      dVar6 = this->py * this->sj0;
                      dVar7 = dVar2 * this->px * this->px;
                      dVar8 = IKsign(dVar2 * dVar3 +
                                     ((((dVar5 * -2.0 * dVar6 +
                                        dVar5 * 0.05 + dVar6 * 0.05 + -0.000625) - dVar7) - dVar4) -
                                     dVar3));
                      dVar2 = IKabs((dVar5 * -3200.0 * dVar6 +
                                    dVar7 * -1600.0 +
                                    dVar4 * -1600.0 +
                                    dVar6 * 80.0 + dVar5 * 80.0 + dVar2 * dVar3 * 1600.0 + -1.0) -
                                    dVar3 * 1600.0);
                      if ((1e-06 <= dVar2) && (dVar2 = IKabs(dVar8), 1e-06 <= dVar2)) {
                        memset((void *)((long)&x85 + 7),0,1);
                        this->_nj1 = '\x01';
                        dVar2 = this->py * this->py;
                        dVar3 = this->cj0 * this->cj0;
                        dVar4 = this->py * this->sj0;
                        dVar5 = this->cj2 * 0.365;
                        dVar6 = this->sj2 * 0.035;
                        dVar7 = this->sj2 * 0.365;
                        dVar8 = this->cj0 * this->px;
                        dVar9 = this->cj2 * 0.035;
                        dVar2 = IKsign(((dVar4 * -2.0 * dVar8 +
                                        dVar2 * dVar3 +
                                        dVar3 * -1.0 * this->px * this->px +
                                        dVar8 * 0.05 + dVar4 * 0.05 + -0.000625) - dVar2) -
                                       this->pz * this->pz);
                        CVar16 = IKPowWithIntegerCheck<double>(dVar2,-1);
                        if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) {
                          CVar17 = IKatan2WithCheck<double>
                                             (this->cj2 * 0.000875 +
                                              this->pz * -1.0 * dVar6 +
                                              this->pz * -1.0 * dVar5 +
                                              dVar7 * dVar8 +
                                              this->pz * -0.315 +
                                              dVar4 * -1.0 * dVar9 +
                                              dVar8 * -1.0 * dVar9 +
                                              this->sj2 * -0.009125 + dVar4 * dVar7,
                                              dVar6 * -1.0 * dVar8 +
                                              dVar8 * -0.315 +
                                              dVar5 * -1.0 * dVar8 +
                                              dVar4 * -0.315 +
                                              this->sj2 * 0.000875 +
                                              dVar4 * -1.0 * dVar6 +
                                              dVar4 * -1.0 * dVar5 +
                                              this->pz * dVar9 +
                                              this->pz * -1.0 * dVar7 +
                                              this->cj2 * 0.009125 + 0.007875,1e-07);
                          if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) {
                            cj1array[0] = CVar16.value * 1.5707963267949 + -1.5707963267949 +
                                          CVar17.value;
                            dStack_220 = IKsin(cj1array[0]);
                            sj1array[0] = IKcos(cj1array[0]);
                            if (cj1array[0] <= 3.14159265358979) {
                              if (cj1array[0] < -3.14159265358979) {
                                cj1array[0] = cj1array[0] + 6.28318530717959;
                              }
                            }
                            else {
                              cj1array[0] = cj1array[0] - 6.28318530717959;
                            }
                            x85._7_1_ = 1;
                            for (evalcond[4]._4_4_ = 0; evalcond[4]._4_4_ < 1;
                                evalcond[4]._4_4_ = evalcond[4]._4_4_ + 1) {
                              if ((*(byte *)((long)&x85 + (long)evalcond[4]._4_4_ + 7) & 1) != 0) {
                                this->_ij1[0] = (uchar)evalcond[4]._4_4_;
                                this->_ij1[1] = 0xff;
                                evalcond[4]._0_4_ = evalcond[4]._4_4_;
                                do {
                                  evalcond[4]._0_4_ = evalcond[4]._0_4_ + 1;
                                  if (0 < evalcond[4]._0_4_) goto LAB_00147702;
                                } while ((((*(byte *)((long)&x85 + (long)evalcond[4]._0_4_ + 7) & 1)
                                           == 0) ||
                                         (dVar2 = IKabs(sj1array[evalcond[4]._4_4_] -
                                                        sj1array[evalcond[4]._0_4_]), 1e-06 <= dVar2
                                         )) || (dVar2 = IKabs(*(double *)
                                                               ((long)&stack0xfffffffffffffde0 +
                                                               (long)evalcond[4]._4_4_ * 8) -
                                                              *(double *)
                                                               ((long)&stack0xfffffffffffffde0 +
                                                               (long)evalcond[4]._0_4_ * 8)),
                                               1e-06 <= dVar2));
                                *(undefined1 *)((long)&x85 + (long)evalcond[4]._0_4_ + 7) = 0;
                                this->_ij1[1] = (uchar)evalcond[4]._0_4_;
LAB_00147702:
                                this->j1 = cj1array[evalcond[4]._4_4_];
                                this->cj1 = sj1array[evalcond[4]._4_4_];
                                this->sj1 = *(IkReal *)
                                             ((long)&stack0xfffffffffffffde0 +
                                             (long)evalcond[4]._4_4_ * 8);
                                dVar4 = IKsin(this->j1);
                                dVar5 = IKcos(this->j1);
                                dVar6 = this->cj2 * 0.365;
                                dVar7 = this->sj2 * 0.035;
                                dVar8 = this->sj2 * 0.365;
                                dVar9 = this->py * this->sj0;
                                dVar10 = this->pz * 1.0;
                                dVar11 = this->cj2 * 0.035;
                                dVar12 = this->cj0 * this->px;
                                dVar2 = this->pp;
                                dVar3 = this->pz;
                                dVar13 = IKabs(dVar10 * -1.0 * dVar5 +
                                               dVar4 * -0.025 +
                                               ((dVar9 * dVar4 + dVar12 * dVar4) - dVar11) + dVar8);
                                if ((((dVar13 <= 1e-05) &&
                                     (dVar13 = IKabs(dVar12 * -1.0 * dVar5 * 1.0 +
                                                     dVar10 * -1.0 * dVar4 +
                                                     dVar5 * 0.025 +
                                                     dVar9 * -1.0 * dVar5 * 1.0 + 0.315 + dVar7 +
                                                     dVar6), dVar13 <= 1e-05)) &&
                                    (dVar10 = IKabs(dVar4 * dVar7 +
                                                    dVar4 * dVar6 +
                                                    dVar4 * 0.315 +
                                                    ((dVar5 * dVar8 + dVar11 * -1.0 * dVar5) -
                                                    dVar10)), dVar10 <= 1e-05)) &&
                                   ((dVar2 = IKabs(dVar9 * 0.05 +
                                                   dVar12 * 0.05 +
                                                   dVar9 * 0.63 * dVar5 +
                                                   dVar3 * 0.63 * dVar4 +
                                                   dVar5 * -0.01575 +
                                                   ((dVar12 * dVar5 * 0.63 + 0.0346) - dVar2)),
                                    dVar2 <= 1e-05 &&
                                    (dVar2 = IKabs(((dVar5 * 0.315 +
                                                    dVar11 * dVar4 +
                                                    dVar5 * dVar7 +
                                                    dVar5 * dVar6 + dVar4 * -1.0 * dVar8 + 0.025) -
                                                   dVar12) - dVar9), dVar2 <= 1e-05)))) {
                                  rotationfunction0(this,solutions);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      memset((void *)((long)&x608 + 7),0,1);
                      this->_nj1 = '\x01';
                      dVar2 = this->cj2 * this->cj2;
                      dVar3 = this->py * this->sj0;
                      dVar4 = this->cj2 * 0.365;
                      dVar5 = this->sj2 * 0.035;
                      dVar6 = this->cj2 * this->sj2;
                      dVar7 = this->cj0 * this->px;
                      dVar8 = this->pz * 1.0;
                      dVar4 = IKsign(dVar7 * -0.315 +
                                     dVar3 * -0.315 +
                                     this->sj2 * 0.000875 +
                                     this->pz * 0.365 * this->sj2 +
                                     dVar5 * -1.0 * dVar7 +
                                     dVar3 * -1.0 * dVar4 +
                                     dVar3 * -1.0 * dVar5 +
                                     dVar4 * -1.0 * dVar7 +
                                     this->cj2 * -0.035 * this->pz + this->cj2 * 0.009125 + 0.007875
                                    );
                      CVar16 = IKPowWithIntegerCheck<double>(dVar4,-1);
                      if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) {
                        CVar17 = IKatan2WithCheck<double>
                                           (this->sj2 * 0.114975 +
                                            dVar6 * 0.132 +
                                            dVar7 * -1.0 * dVar8 +
                                            this->cj2 * -0.011025 +
                                            dVar2 * -0.02555 +
                                            dVar3 * -1.0 * dVar8 + this->pz * 0.025 + 0.012775,
                                            this->cj2 * -0.22995 +
                                            dVar2 * -0.132 +
                                            this->sj2 * -0.02205 +
                                            dVar6 * -0.02555 + this->pz * this->pz + -0.10045,1e-07)
                        ;
                        if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) {
                          cj1array_1[0] =
                               CVar16.value * 1.5707963267949 + -1.5707963267949 + CVar17.value;
                          dStack_328 = IKsin(cj1array_1[0]);
                          sj1array_1[0] = IKcos(cj1array_1[0]);
                          if (cj1array_1[0] <= 3.14159265358979) {
                            if (cj1array_1[0] < -3.14159265358979) {
                              cj1array_1[0] = cj1array_1[0] + 6.28318530717959;
                            }
                          }
                          else {
                            cj1array_1[0] = cj1array_1[0] - 6.28318530717959;
                          }
                          x608._7_1_ = 1;
                          for (evalcond_1[4]._4_4_ = 0; evalcond_1[4]._4_4_ < 1;
                              evalcond_1[4]._4_4_ = evalcond_1[4]._4_4_ + 1) {
                            if ((*(byte *)((long)&x608 + (long)evalcond_1[4]._4_4_ + 7) & 1) != 0) {
                              this->_ij1[0] = (uchar)evalcond_1[4]._4_4_;
                              this->_ij1[1] = 0xff;
                              evalcond_1[4]._0_4_ = evalcond_1[4]._4_4_;
                              do {
                                evalcond_1[4]._0_4_ = evalcond_1[4]._0_4_ + 1;
                                if (0 < evalcond_1[4]._0_4_) goto LAB_00148133;
                              } while ((((*(byte *)((long)&x608 + (long)evalcond_1[4]._0_4_ + 7) & 1
                                         ) == 0) ||
                                       (dVar2 = IKabs(sj1array_1[evalcond_1[4]._4_4_] -
                                                      sj1array_1[evalcond_1[4]._0_4_]),
                                       1e-06 <= dVar2)) ||
                                      (dVar2 = IKabs(*(double *)
                                                      ((long)&stack0xfffffffffffffcd8 +
                                                      (long)evalcond_1[4]._4_4_ * 8) -
                                                     *(double *)
                                                      ((long)&stack0xfffffffffffffcd8 +
                                                      (long)evalcond_1[4]._0_4_ * 8)),
                                      1e-06 <= dVar2));
                              *(undefined1 *)((long)&x608 + (long)evalcond_1[4]._0_4_ + 7) = 0;
                              this->_ij1[1] = (uchar)evalcond_1[4]._0_4_;
LAB_00148133:
                              this->j1 = cj1array_1[evalcond_1[4]._4_4_];
                              this->cj1 = sj1array_1[evalcond_1[4]._4_4_];
                              this->sj1 = *(IkReal *)
                                           ((long)&stack0xfffffffffffffcd8 +
                                           (long)evalcond_1[4]._4_4_ * 8);
                              dVar4 = IKsin(this->j1);
                              dVar5 = IKcos(this->j1);
                              dVar6 = this->cj2 * 0.365;
                              dVar7 = this->sj2 * 0.035;
                              dVar8 = this->sj2 * 0.365;
                              dVar9 = this->py * this->sj0;
                              dVar10 = this->pz * 1.0;
                              dVar11 = this->cj2 * 0.035;
                              dVar12 = this->cj0 * this->px;
                              dVar2 = this->pz;
                              dVar3 = this->pp;
                              dVar13 = IKabs(dVar5 * -1.0 * dVar10 +
                                             dVar4 * -0.025 +
                                             ((dVar4 * dVar12 + dVar4 * dVar9) - dVar11) + dVar8);
                              if ((((dVar13 <= 1e-05) &&
                                   (dVar13 = IKabs(dVar12 * -1.0 * dVar5 * 1.0 +
                                                   dVar4 * -1.0 * dVar10 +
                                                   dVar9 * -1.0 * dVar5 * 1.0 +
                                                   dVar5 * 0.025 + 0.315 + dVar6 + dVar7),
                                   dVar13 <= 1e-05)) &&
                                  (dVar10 = IKabs(dVar5 * -1.0 * dVar11 +
                                                  dVar4 * 0.315 +
                                                  dVar4 * dVar6 +
                                                  dVar5 * dVar8 + dVar4 * dVar7 + dVar10 * -1.0),
                                  dVar10 <= 1e-05)) &&
                                 ((dVar2 = IKabs(dVar5 * -0.01575 +
                                                 dVar5 * dVar12 * 0.63 +
                                                 ((dVar2 * 0.63 * dVar4 +
                                                  dVar9 * 0.05 +
                                                  dVar12 * 0.05 + dVar5 * 0.63 * dVar9 + 0.0346) -
                                                 dVar3)), dVar2 <= 1e-05 &&
                                  (dVar2 = IKabs(dVar5 * dVar6 +
                                                 dVar5 * 0.315 +
                                                 (((dVar4 * -1.0 * dVar8 +
                                                   dVar5 * dVar7 + dVar4 * dVar11 + 0.025) - dVar9)
                                                 - dVar12)), dVar2 <= 1e-05)))) {
                                rotationfunction0(this,solutions);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    memset((void *)((long)&x628 + 7),0,1);
                    this->_nj1 = '\x01';
                    dVar2 = this->cj2 * this->cj2;
                    dVar3 = this->cj2 * this->sj2;
                    dVar4 = this->sj2 * 0.365;
                    dVar5 = this->py * this->sj0;
                    dVar6 = this->cj0 * this->px;
                    dVar7 = this->cj2 * 0.035;
                    CVar16 = IKatan2WithCheck<double>
                                       (dVar3 * 0.02555 +
                                        this->pz * this->pz + dVar2 * 0.132 + -0.133225,
                                        this->pz * -0.025 +
                                        this->sj2 * 0.114975 +
                                        this->cj2 * -0.011025 +
                                        dVar3 * 0.132 +
                                        this->pz * dVar6 +
                                        this->pz * dVar5 + dVar2 * -0.02555 + 0.012775,1e-07);
                    if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                    {
                      dVar2 = IKsign(dVar6 * -1.0 * dVar7 +
                                     this->cj2 * 0.000875 +
                                     this->cj2 * 0.365 * this->pz +
                                     this->pz * 0.035 * this->sj2 +
                                     dVar4 * dVar5 +
                                     dVar4 * dVar6 +
                                     this->pz * 0.315 + this->sj2 * -0.009125 + dVar5 * -1.0 * dVar7
                                    );
                      CVar17 = IKPowWithIntegerCheck<double>(dVar2,-1);
                      if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) {
                        cj1array_2[0] =
                             CVar17.value * 1.5707963267949 + CVar16.value + -1.5707963267949;
                        dStack_428 = IKsin(cj1array_2[0]);
                        sj1array_2[0] = IKcos(cj1array_2[0]);
                        if (cj1array_2[0] <= 3.14159265358979) {
                          if (cj1array_2[0] < -3.14159265358979) {
                            cj1array_2[0] = cj1array_2[0] + 6.28318530717959;
                          }
                        }
                        else {
                          cj1array_2[0] = cj1array_2[0] - 6.28318530717959;
                        }
                        x628._7_1_ = 1;
                        for (local_484 = 0; local_484 < 1; local_484 = local_484 + 1) {
                          if ((*(byte *)((long)&x628 + (long)local_484 + 7) & 1) != 0) {
                            this->_ij1[0] = (uchar)local_484;
                            this->_ij1[1] = 0xff;
                            local_488 = local_484;
                            do {
                              local_488 = local_488 + 1;
                              if (0 < local_488) goto LAB_00148ae6;
                            } while ((((*(byte *)((long)&x628 + (long)local_488 + 7) & 1) == 0) ||
                                     (dVar2 = IKabs(sj1array_2[local_484] - sj1array_2[local_488]),
                                     1e-06 <= dVar2)) ||
                                    (dVar2 = IKabs(*(double *)
                                                    ((long)&stack0xfffffffffffffbd8 +
                                                    (long)local_484 * 8) -
                                                   *(double *)
                                                    ((long)&stack0xfffffffffffffbd8 +
                                                    (long)local_488 * 8)), 1e-06 <= dVar2));
                            *(undefined1 *)((long)&x628 + (long)local_488 + 7) = 0;
                            this->_ij1[1] = (uchar)local_488;
LAB_00148ae6:
                            this->j1 = cj1array_2[local_484];
                            this->cj1 = sj1array_2[local_484];
                            this->sj1 = *(IkReal *)
                                         ((long)&stack0xfffffffffffffbd8 + (long)local_484 * 8);
                            dVar4 = IKsin(this->j1);
                            dVar5 = IKcos(this->j1);
                            dVar6 = this->cj2 * 0.365;
                            dVar7 = this->sj2 * 0.035;
                            dVar8 = this->sj2 * 0.365;
                            dVar9 = this->py * this->sj0;
                            dVar10 = this->pz * 1.0;
                            dVar11 = this->cj2 * 0.035;
                            dVar12 = this->cj0 * this->px;
                            dVar2 = this->pp;
                            dVar3 = this->pz;
                            dVar13 = IKabs(dVar5 * -1.0 * dVar10 +
                                           ((dVar4 * -0.025 + dVar4 * dVar12 + dVar4 * dVar9) -
                                           dVar11) + dVar8);
                            if ((((dVar13 <= 1e-05) &&
                                 (dVar13 = IKabs(dVar4 * -1.0 * dVar10 +
                                                 dVar12 * -1.0 * dVar5 * 1.0 +
                                                 dVar5 * 0.025 + dVar9 * -1.0 * dVar5 * 1.0 + 0.315
                                                 + dVar6 + dVar7), dVar13 <= 1e-05)) &&
                                (dVar10 = IKabs(dVar5 * -1.0 * dVar11 +
                                                ((dVar5 * dVar8 +
                                                 dVar4 * dVar6 + dVar4 * 0.315 + dVar4 * dVar7) -
                                                dVar10)), dVar10 <= 1e-05)) &&
                               ((dVar2 = IKabs(dVar3 * 0.63 * dVar4 +
                                               dVar5 * dVar12 * 0.63 +
                                               dVar12 * 0.05 +
                                               dVar9 * 0.05 +
                                               ((dVar5 * 0.63 * dVar9 + dVar5 * -0.01575 + 0.0346) -
                                               dVar2)), dVar2 <= 1e-05 &&
                                (dVar2 = IKabs(dVar5 * dVar6 +
                                               dVar5 * dVar7 +
                                               dVar4 * -1.0 * dVar8 +
                                               dVar5 * 0.315 +
                                               dVar4 * dVar11 + ((0.025 - dVar9) - dVar12)),
                                dVar2 <= 1e-05)))) {
                              rotationfunction0(this,solutions);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    x54._4_4_ = x54._4_4_ + 1;
  } while( true );
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) < -1-IKFAST_SINCOS_THRESH || (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp))));
j2array[0]=((-1.47519820813106)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.66639444545874)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj2*pz);
IkReal x62=(cj0*px);
IkReal x63=(cj2*sj2);
IkReal x64=((0.365)*sj2);
IkReal x65=(py*sj0);
IkReal x66=((0.035)*cj2);
IkReal x67=((417.142857142857)*sj2);
IkReal x68=(pz*sj2);
IkReal x69=((40.0)*cj2);
j1eval[0]=((((360.0)*pz))+cj2+((x62*x67))+(((-10.4285714285714)*sj2))+(((417.142857142857)*x61))+(((-1.0)*x65*x69))+(((40.0)*x68))+(((-1.0)*x62*x69))+((x65*x67)));
j1eval[1]=((IKabs(((0.012775)+(((0.132)*x63))+(((-0.011025)*cj2))+(((-0.02555)*x60))+((pz*x65))+((pz*x62))+(((0.114975)*sj2))+(((-0.025)*pz)))))+(IKabs(((-0.133225)+(((0.132)*x60))+(pz*pz)+(((0.02555)*x63))))));
j1eval[2]=IKsign(((((-0.009125)*sj2))+(((0.035)*x68))+((x62*x64))+(((-1.0)*x65*x66))+(((0.315)*pz))+(((0.365)*x61))+((x64*x65))+(((0.000875)*cj2))+(((-1.0)*x62*x66))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(cj0*px);
IkReal x71=(pz*sj2);
IkReal x72=(cj2*pz);
IkReal x73=(py*sj0);
IkReal x74=((417.142857142857)*cj2);
IkReal x75=((0.365)*cj2);
IkReal x76=(sj2*x73);
j1eval[0]=((9.0)+(((-360.0)*x73))+(((-360.0)*x70))+(((417.142857142857)*x71))+sj2+(((-1.0)*x70*x74))+(((10.4285714285714)*cj2))+(((-40.0)*x76))+(((-40.0)*x72))+(((-1.0)*x73*x74))+(((-40.0)*sj2*x70)));
j1eval[1]=IKsign(((0.007875)+(((0.009125)*cj2))+(((-1.0)*x70*x75))+(((-0.035)*x72))+(((-0.035)*x76))+(((0.365)*x71))+(((0.000875)*sj2))+(((-1.0)*x73*x75))+(((-0.315)*x70))+(((-0.315)*x73))+(((-0.035)*sj2*x70))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x77=cj0*cj0;
IkReal x78=py*py;
IkReal x79=px*px;
IkReal x80=pz*pz;
IkReal x81=(cj0*px);
IkReal x82=(py*sj0);
IkReal x83=((1600.0)*x78);
IkReal x84=(x77*x79);
j1eval[0]=((-1.0)+((x77*x83))+(((80.0)*x81))+(((80.0)*x82))+(((-1600.0)*x80))+(((-1600.0)*x84))+(((-3200.0)*x81*x82))+(((-1.0)*x83)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x82))+(((0.05)*x81))+(((-2.0)*x81*x82))+(((-1.0)*x84))+(((-1.0)*x80))+(((-1.0)*x78))+((x77*x78))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x85=py*py;
IkReal x86=cj0*cj0;
IkReal x87=(py*sj0);
IkReal x88=((0.365)*cj2);
IkReal x89=((0.035)*sj2);
IkReal x90=((0.365)*sj2);
IkReal x91=(cj0*px);
IkReal x92=((0.035)*cj2);
CheckValue<IkReal> x93=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x87))+(((0.05)*x91))+(((-1.0)*x86*(px*px)))+((x85*x86))+(((-2.0)*x87*x91))+(((-1.0)*x85))+(((-1.0)*(pz*pz))))),-1);
if(!x93.valid){
continue;
}
CheckValue<IkReal> x94 = IKatan2WithCheck(IkReal(((((-0.009125)*sj2))+((x87*x90))+(((-1.0)*x91*x92))+(((-1.0)*x87*x92))+(((-0.315)*pz))+((x90*x91))+(((-1.0)*pz*x88))+(((-1.0)*pz*x89))+(((0.000875)*cj2)))),IkReal(((0.007875)+(((0.009125)*cj2))+(((-1.0)*pz*x90))+((pz*x92))+(((-1.0)*x87*x88))+(((-1.0)*x87*x89))+(((0.000875)*sj2))+(((-0.315)*x87))+(((-1.0)*x88*x91))+(((-0.315)*x91))+(((-1.0)*x89*x91)))),IKFAST_ATAN2_MAGTHRESH);
if(!x94.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x93.value)))+(x94.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x95=IKsin(j1);
IkReal x96=IKcos(j1);
IkReal x97=((0.365)*cj2);
IkReal x98=((0.035)*sj2);
IkReal x99=((0.365)*sj2);
IkReal x100=(py*sj0);
IkReal x101=((1.0)*pz);
IkReal x102=((0.035)*cj2);
IkReal x103=(cj0*px);
IkReal x104=((1.0)*x96);
IkReal x105=(x103*x96);
evalcond[0]=(((x100*x95))+((x103*x95))+(((-1.0)*x102))+(((-0.025)*x95))+x99+(((-1.0)*x101*x96)));
evalcond[1]=((0.315)+(((-1.0)*x100*x104))+(((0.025)*x96))+x98+x97+(((-1.0)*x101*x95))+(((-1.0)*x103*x104)));
evalcond[2]=(((x96*x99))+(((-1.0)*x102*x96))+(((-1.0)*x101))+(((0.315)*x95))+((x95*x97))+((x95*x98)));
evalcond[3]=((0.0346)+(((0.63)*x105))+(((-1.0)*pp))+(((-0.01575)*x96))+(((0.63)*pz*x95))+(((0.63)*x100*x96))+(((0.05)*x103))+(((0.05)*x100)));
evalcond[4]=((0.025)+(((-1.0)*x95*x99))+((x96*x97))+((x96*x98))+((x102*x95))+(((0.315)*x96))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x608=cj2*cj2;
IkReal x609=(py*sj0);
IkReal x610=((0.365)*cj2);
IkReal x611=((0.035)*sj2);
IkReal x612=(cj2*sj2);
IkReal x613=(cj0*px);
IkReal x614=((1.0)*pz);
CheckValue<IkReal> x615=IKPowWithIntegerCheck(IKsign(((0.007875)+(((0.009125)*cj2))+(((-0.035)*cj2*pz))+(((-1.0)*x610*x613))+(((-1.0)*x609*x611))+(((-1.0)*x609*x610))+(((-1.0)*x611*x613))+(((0.365)*pz*sj2))+(((0.000875)*sj2))+(((-0.315)*x609))+(((-0.315)*x613)))),-1);
if(!x615.valid){
continue;
}
CheckValue<IkReal> x616 = IKatan2WithCheck(IkReal(((0.012775)+(((0.025)*pz))+(((-1.0)*x609*x614))+(((-0.02555)*x608))+(((-0.011025)*cj2))+(((-1.0)*x613*x614))+(((0.132)*x612))+(((0.114975)*sj2)))),IkReal(((-0.10045)+(pz*pz)+(((-0.02555)*x612))+(((-0.02205)*sj2))+(((-0.132)*x608))+(((-0.22995)*cj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x616.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x615.value)))+(x616.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x617=IKsin(j1);
IkReal x618=IKcos(j1);
IkReal x619=((0.365)*cj2);
IkReal x620=((0.035)*sj2);
IkReal x621=((0.365)*sj2);
IkReal x622=(py*sj0);
IkReal x623=((1.0)*pz);
IkReal x624=((0.035)*cj2);
IkReal x625=(cj0*px);
IkReal x626=((1.0)*x618);
IkReal x627=(x618*x625);
evalcond[0]=(((x617*x625))+((x617*x622))+(((-1.0)*x624))+(((-0.025)*x617))+x621+(((-1.0)*x618*x623)));
evalcond[1]=((0.315)+(((0.025)*x618))+(((-1.0)*x622*x626))+(((-1.0)*x617*x623))+(((-1.0)*x625*x626))+x619+x620);
evalcond[2]=(((x617*x620))+(((-1.0)*x623))+((x618*x621))+((x617*x619))+(((0.315)*x617))+(((-1.0)*x618*x624)));
evalcond[3]=((0.0346)+(((0.63)*x618*x622))+(((0.05)*x625))+(((0.05)*x622))+(((0.63)*pz*x617))+(((-1.0)*pp))+(((0.63)*x627))+(((-0.01575)*x618)));
evalcond[4]=((0.025)+((x617*x624))+((x618*x620))+(((-1.0)*x617*x621))+(((-1.0)*x622))+(((-1.0)*x625))+(((0.315)*x618))+((x618*x619)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x628=cj2*cj2;
IkReal x629=(cj2*sj2);
IkReal x630=((0.365)*sj2);
IkReal x631=(py*sj0);
IkReal x632=(cj0*px);
IkReal x633=((0.035)*cj2);
CheckValue<IkReal> x634 = IKatan2WithCheck(IkReal(((-0.133225)+(((0.132)*x628))+(pz*pz)+(((0.02555)*x629)))),IkReal(((0.012775)+(((-0.02555)*x628))+((pz*x631))+((pz*x632))+(((0.132)*x629))+(((-0.011025)*cj2))+(((0.114975)*sj2))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x634.valid){
continue;
}
CheckValue<IkReal> x635=IKPowWithIntegerCheck(IKsign(((((-0.009125)*sj2))+(((-1.0)*x631*x633))+(((0.315)*pz))+((x630*x632))+((x630*x631))+(((0.035)*pz*sj2))+(((0.365)*cj2*pz))+(((0.000875)*cj2))+(((-1.0)*x632*x633)))),-1);
if(!x635.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x634.value)+(((1.5707963267949)*(x635.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x636=IKsin(j1);
IkReal x637=IKcos(j1);
IkReal x638=((0.365)*cj2);
IkReal x639=((0.035)*sj2);
IkReal x640=((0.365)*sj2);
IkReal x641=(py*sj0);
IkReal x642=((1.0)*pz);
IkReal x643=((0.035)*cj2);
IkReal x644=(cj0*px);
IkReal x645=((1.0)*x637);
IkReal x646=(x637*x644);
evalcond[0]=(((x636*x644))+((x636*x641))+(((-0.025)*x636))+(((-1.0)*x643))+x640+(((-1.0)*x637*x642)));
evalcond[1]=((0.315)+(((-1.0)*x641*x645))+(((0.025)*x637))+(((-1.0)*x644*x645))+x638+x639+(((-1.0)*x636*x642)));
evalcond[2]=((((0.315)*x636))+((x636*x639))+((x636*x638))+((x637*x640))+(((-1.0)*x642))+(((-1.0)*x637*x643)));
evalcond[3]=((0.0346)+(((-0.01575)*x637))+(((0.63)*x637*x641))+(((-1.0)*pp))+(((0.05)*x641))+(((0.05)*x644))+(((0.63)*x646))+(((0.63)*pz*x636)));
evalcond[4]=((0.025)+(((-1.0)*x641))+(((-1.0)*x644))+((x636*x643))+(((0.315)*x637))+(((-1.0)*x636*x640))+((x637*x639))+((x637*x638)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}